

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::compute::anon_unknown_0::CopySSBOToImageTestInstance::iterate
          (TestStatus *__return_storage_ptr__,CopySSBOToImageTestInstance *this)

{
  VkAllocationCallbacks **ppVVar1;
  VkDescriptorPool descriptorPool_00;
  VkDescriptorSet destSet;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer_s *pVVar2;
  deUint64 dVar3;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  VkImageSubresourceRange subresourceRange_02;
  RefData<vk::Handle<(vk::HandleType)13>_> data;
  RefData<vk::Handle<(vk::HandleType)19>_> data_00;
  RefData<vk::Handle<(vk::HandleType)21>_> data_01;
  RefData<vk::Handle<(vk::HandleType)22>_> data_02;
  RefData<vk::Handle<(vk::HandleType)14>_> data_03;
  RefData<vk::Handle<(vk::HandleType)16>_> data_04;
  RefData<vk::Handle<(vk::HandleType)18>_> data_05;
  RefData<vk::Handle<(vk::HandleType)24>_> data_06;
  RefData<vk::VkCommandBuffer_s_*> data_07;
  deUint32 queueFamilyIndex_00;
  uint uVar4;
  deUint32 dVar5;
  uint uVar6;
  uint uVar7;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  VkImage *pVVar8;
  Allocation *pAVar9;
  VkDeviceSize VVar10;
  DescriptorSetLayoutBuilder *pDVar11;
  DescriptorPoolBuilder *pDVar12;
  Handle<(vk::HandleType)21> *pHVar13;
  Handle<(vk::HandleType)19> *pHVar14;
  Handle<(vk::HandleType)13> *pHVar15;
  VkBuffer *pVVar16;
  Handle<(vk::HandleType)22> *pHVar17;
  DescriptorSetUpdateBuilder *pDVar18;
  ProgramCollection<vk::ProgramBinary> *this_00;
  ProgramBinary *binary;
  Handle<(vk::HandleType)16> *pHVar19;
  Handle<(vk::HandleType)14> *pHVar20;
  Handle<(vk::HandleType)24> *pHVar21;
  VkCommandBuffer_s **ppVVar22;
  Handle<(vk::HandleType)18> *pHVar23;
  VkDeviceMemory memory;
  void *pvVar24;
  void *pvVar25;
  ostream *this_01;
  allocator<char> local_aa1;
  string local_aa0;
  undefined4 local_a7c;
  string local_a78;
  ostringstream local_a58 [8];
  ostringstream msg;
  deUint32 ref;
  deUint32 res;
  deUint32 ndx;
  deUint32 *refBufferPtr;
  deUint32 *bufferPtr;
  Allocation *outputBufferAllocation;
  Move<vk::VkCommandBuffer_s_*> local_888;
  RefData<vk::VkCommandBuffer_s_*> local_868;
  undefined1 local_848 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_808;
  undefined1 local_7e8 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  IVec2 workSize;
  VkBufferImageCopy copyParams;
  undefined1 local_780 [8];
  VkBufferMemoryBarrier outputBufferPostCopyBarrier;
  undefined1 local_720 [8];
  VkImageMemoryBarrier imagePreCopyBarrier;
  undefined1 local_6b0 [8];
  VkImageMemoryBarrier imageLayoutBarrier;
  undefined1 local_660 [8];
  VkBufferMemoryBarrier inputBufferPostHostWriteBarrier;
  Move<vk::Handle<(vk::HandleType)18>_> local_618;
  RefData<vk::Handle<(vk::HandleType)18>_> local_5f8;
  undefined1 local_5d8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::Handle<(vk::HandleType)16>_> local_5b0;
  RefData<vk::Handle<(vk::HandleType)16>_> local_590;
  undefined1 local_570 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  string local_548;
  Move<vk::Handle<(vk::HandleType)14>_> local_528;
  RefData<vk::Handle<(vk::HandleType)14>_> local_508;
  undefined1 local_4e8 [8];
  Unique<vk::Handle<(vk::HandleType)14>_> shaderModule;
  Location local_4b8;
  VkDescriptorSet local_4b0;
  DescriptorSetUpdateBuilder local_4a8;
  deUint64 local_460;
  undefined1 local_458 [8];
  VkDescriptorBufferInfo bufferDescriptorInfo;
  VkSampler local_438;
  undefined1 local_430 [8];
  VkDescriptorImageInfo imageDescriptorInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_408;
  RefData<vk::Handle<(vk::HandleType)22>_> local_3e8;
  undefined1 local_3c8 [8];
  Unique<vk::Handle<(vk::HandleType)22>_> descriptorSet;
  Move<vk::Handle<(vk::HandleType)21>_> local_390;
  RefData<vk::Handle<(vk::HandleType)21>_> local_370;
  undefined1 local_350 [8];
  Unique<vk::Handle<(vk::HandleType)21>_> descriptorPool;
  Move<vk::Handle<(vk::HandleType)19>_> local_2e8;
  RefData<vk::Handle<(vk::HandleType)19>_> local_2c8;
  undefined1 local_2a8 [8];
  Unique<vk::Handle<(vk::HandleType)19>_> descriptorSetLayout;
  VkBufferCreateInfo local_280;
  undefined1 local_248 [8];
  Buffer outputBuffer;
  uint local_20c;
  deUint32 *pdStack_208;
  deUint32 i;
  deUint32 *bufferPtr_1;
  Allocation *inputBufferAllocation;
  Random rnd;
  undefined1 local_1a8 [8];
  Buffer inputBuffer;
  VkDeviceSize bufferSizeBytes;
  deUint32 imageArea;
  Move<vk::Handle<(vk::HandleType)13>_> local_140;
  RefData<vk::Handle<(vk::HandleType)13>_> local_120;
  undefined1 local_100 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> imageView;
  VkImageSubresourceRange subresourceRange;
  Image image;
  VkImageCreateInfo imageParams;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  CopySSBOToImageTestInstance *this_local;
  
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  queueFamilyIndex_00 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator_00 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  ppVVar1 = &image.m_image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
  make2DImageCreateInfo((VkImageCreateInfo *)ppVVar1,&this->m_imageSize,9);
  subresourceRange.baseArrayLayer = ::vk::MemoryRequirement::Any.m_flags;
  compute::Image::Image
            ((Image *)&subresourceRange.layerCount,vk_00,device_00,allocator_00,
             (VkImageCreateInfo *)ppVVar1,::vk::MemoryRequirement::Any);
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)
             &imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator,1,
             0,1,0,1);
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  subresourceRange_00.levelCount = subresourceRange.aspectMask;
  subresourceRange_00._0_8_ =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  subresourceRange_00.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_00.layerCount = subresourceRange.levelCount;
  makeImageView(&local_140,vk_00,device_00,(VkImage)pVVar8->m_internal,VK_IMAGE_VIEW_TYPE_2D,
                VK_FORMAT_R32_UINT,subresourceRange_00);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data.deleter.m_deviceIface._0_4_ = (int)local_120.deleter.m_deviceIface;
  data.object.m_internal = local_120.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_120.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_120.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_120.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_120.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_120.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_100,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_140);
  uVar4 = compute::(anonymous_namespace)::multiplyComponents<int,2>(&this->m_imageSize);
  inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)((ulong)uVar4 << 2);
  makeBufferCreateInfo
            ((VkBufferCreateInfo *)&rnd.m_rnd.w,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,0x20);
  rnd.m_rnd.z = ::vk::MemoryRequirement::HostVisible.m_flags;
  compute::Buffer::Buffer
            ((Buffer *)local_1a8,vk_00,device_00,allocator_00,(VkBufferCreateInfo *)&rnd.m_rnd.w,
             ::vk::MemoryRequirement::HostVisible);
  de::Random::Random((Random *)((long)&inputBufferAllocation + 4),0x77238ac2);
  pAVar9 = compute::Buffer::getAllocation((Buffer *)local_1a8);
  pdStack_208 = (deUint32 *)::vk::Allocation::getHostPtr(pAVar9);
  for (local_20c = 0; local_20c < uVar4; local_20c = local_20c + 1) {
    dVar5 = de::Random::getUint32((Random *)((long)&inputBufferAllocation + 4));
    *pdStack_208 = dVar5;
    pdStack_208 = pdStack_208 + 1;
  }
  outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::Allocation::getMemory(pAVar9);
  VVar10 = ::vk::Allocation::getOffset(pAVar9);
  ::vk::flushMappedMemoryRange
            (vk_00,device_00,
             (VkDeviceMemory)
             outputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,VVar10,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  de::Random::~Random((Random *)((long)&inputBufferAllocation + 4));
  makeBufferCreateInfo
            (&local_280,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator,2);
  descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  compute::Buffer::Buffer
            ((Buffer *)local_248,vk_00,device_00,allocator_00,&local_280,
             ::vk::MemoryRequirement::HostVisible);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  pDVar11 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      ((DescriptorSetLayoutBuilder *)
                       &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter
                        .m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  pDVar11 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (pDVar11,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_2e8,pDVar11,vk_00,device_00,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_2c8,(Move *)&local_2e8);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_2c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_2c8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_2c8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_2c8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_2c8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_2c8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_2c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2a8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_2e8);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)
             &descriptorPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
              m_allocator);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pDVar12 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)
                       &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                        m_pool,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  pDVar12 = ::vk::DescriptorPoolBuilder::addType(pDVar12,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build(&local_390,pDVar12,vk_00,device_00,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_370,(Move *)&local_390);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_370.deleter.m_deviceIface;
  data_01.object.m_internal = local_370.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_370.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_370.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_370.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_370.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_370.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_350,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_390);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder
            ((DescriptorPoolBuilder *)
             &descriptorSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool);
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)21>_> *)local_350);
  descriptorPool_00.m_internal = pHVar13->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2a8);
  imageDescriptorInfo._16_8_ = pHVar14->m_internal;
  makeDescriptorSet(&local_408,vk_00,device_00,descriptorPool_00,
                    (VkDescriptorSetLayout)imageDescriptorInfo._16_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3e8,(Move *)&local_408);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_3e8.deleter.m_deviceIface;
  data_02.object.m_internal = local_3e8.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3e8.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_3e8.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_3e8.deleter.m_device >> 0x20);
  data_02.deleter.m_pool.m_internal._0_4_ = (int)local_3e8.deleter.m_pool.m_internal;
  data_02.deleter.m_pool.m_internal._4_4_ = (int)(local_3e8.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3c8,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_408);
  ::vk::Handle<(vk::HandleType)20>::Handle(&local_438,0);
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_100);
  bufferDescriptorInfo.range = pHVar15->m_internal;
  ::vk::makeDescriptorImageInfo
            ((VkDescriptorImageInfo *)local_430,local_438,(VkImageView)bufferDescriptorInfo.range,
             VK_IMAGE_LAYOUT_GENERAL);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_1a8);
  local_460 = pVVar16->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_458,(VkBuffer)local_460,0,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_4a8);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3c8);
  local_4b0.m_internal = pHVar17->m_internal;
  local_4b8 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (&local_4a8,local_4b0,&local_4b8,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                       (VkDescriptorBufferInfo *)local_458);
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3c8);
  destSet.m_internal = pHVar17->m_internal;
  shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar18 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      (pDVar18,destSet,
                       (Location *)
                       &shaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
                        m_allocator,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,
                       (VkDescriptorImageInfo *)local_430);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar18,vk_00,device_00);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_4a8);
  this_00 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"comp",
             (allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this_00,&local_548);
  ::vk::createShaderModule(&local_528,vk_00,device_00,binary,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_508,(Move *)&local_528);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_508.deleter.m_deviceIface;
  data_03.object.m_internal = local_508.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_508.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_508.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_508.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_508.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_508.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_4e8,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)14>_>::~Move(&local_528);
  std::__cxx11::string::~string((string *)&local_548);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                     m_allocator + 7));
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)19>_> *)local_2a8);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar14->m_internal;
  makePipelineLayout(&local_5b0,vk_00,device_00,
                     (VkDescriptorSetLayout)
                     pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
                     m_allocator);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_590,(Move *)&local_5b0);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_590.deleter.m_deviceIface;
  data_04.object.m_internal = local_590.object.m_internal;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_590.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_590.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_590.deleter.m_device >> 0x20);
  data_04.deleter.m_allocator._0_4_ = (int)local_590.deleter.m_allocator;
  data_04.deleter.m_allocator._4_4_ = (int)((ulong)local_590.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_570,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_5b0);
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_570);
  pipelineLayout_00.m_internal = pHVar19->m_internal;
  pHVar20 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)14>_> *)local_4e8);
  inputBufferPostHostWriteBarrier.size = pHVar20->m_internal;
  makeComputePipeline(&local_618,vk_00,device_00,pipelineLayout_00,
                      (VkShaderModule)inputBufferPostHostWriteBarrier.size);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5f8,(Move *)&local_618);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_5f8.deleter.m_deviceIface;
  data_05.object.m_internal = local_5f8.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5f8.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_5f8.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_5f8.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_5f8.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_5f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5d8,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_618);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_1a8);
  imageLayoutBarrier._64_8_ = pVVar16->m_internal;
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_660,0x4000,0x20,(VkBuffer)imageLayoutBarrier._64_8_,0,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  imagePreCopyBarrier._64_8_ =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  subresourceRange_01.levelCount = subresourceRange.aspectMask;
  subresourceRange_01._0_8_ =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  subresourceRange_01.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_01.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_6b0,0,0,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL
             ,(VkImage)pVVar8->m_internal,subresourceRange_01);
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  outputBufferPostCopyBarrier.size =
       (VkDeviceSize)
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  subresourceRange_02.levelCount = subresourceRange.aspectMask;
  subresourceRange_02._0_8_ =
       imageView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator;
  subresourceRange_02.baseArrayLayer = subresourceRange.baseMipLevel;
  subresourceRange_02.layerCount = subresourceRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_720,0x40,0x800,VK_IMAGE_LAYOUT_GENERAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pVVar8->m_internal,subresourceRange_02);
  pVVar16 = compute::Buffer::operator*((Buffer *)local_248);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_780,0x1000,0x2000,(VkBuffer)pVVar16->m_internal,0,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  makeBufferImageCopy((VkBufferImageCopy *)&workSize,&this->m_imageSize);
  tcu::operator/((tcu *)&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                         m_allocator,&this->m_imageSize,&this->m_localSize);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,queueFamilyIndex_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_808,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_06.deleter.m_deviceIface._0_4_ = (int)local_808.deleter.m_deviceIface;
  data_06.object.m_internal = local_808.object.m_internal;
  data_06.deleter.m_deviceIface._4_4_ = (int)((ulong)local_808.deleter.m_deviceIface >> 0x20);
  data_06.deleter.m_device._0_4_ = (int)local_808.deleter.m_device;
  data_06.deleter.m_device._4_4_ = (int)((ulong)local_808.deleter.m_device >> 0x20);
  data_06.deleter.m_allocator._0_4_ = (int)local_808.deleter.m_allocator;
  data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_808.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_7e8,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_7e8);
  ::vk::allocateCommandBuffer
            (&local_888,vk_00,device_00,(VkCommandPool)pHVar21->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_868,(Move *)&local_888);
  data_07.deleter.m_deviceIface._0_4_ = (int)local_868.deleter.m_deviceIface;
  data_07.object = local_868.object;
  data_07.deleter.m_deviceIface._4_4_ = (int)((ulong)local_868.deleter.m_deviceIface >> 0x20);
  data_07.deleter.m_device._0_4_ = (int)local_868.deleter.m_device;
  data_07.deleter.m_device._4_4_ = (int)((ulong)local_868.deleter.m_device >> 0x20);
  data_07.deleter.m_pool.m_internal._0_4_ = (int)local_868.deleter.m_pool.m_internal;
  data_07.deleter.m_pool.m_internal._4_4_ = (int)(local_868.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_848,data_07);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_888);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_848);
  beginCommandBuffer(vk_00,*ppVVar22);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_848);
  pVVar2 = *ppVVar22;
  pHVar23 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_5d8);
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar2,1,pHVar23->m_internal);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_848);
  pVVar2 = *ppVVar22;
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_570);
  dVar3 = pHVar19->m_internal;
  pHVar17 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::get
                      ((RefBase<vk::Handle<(vk::HandleType)22>_> *)local_3c8);
  (*vk_00->_vptr_DeviceInterface[0x56])(vk_00,pVVar2,1,dVar3,0,1,pHVar17,0,0);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_848);
  (*vk_00->_vptr_DeviceInterface[0x6d])
            (vk_00,*ppVVar22,0x4000,0x800,0,0,0,1,(int)local_660,1,local_6b0);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_848);
  pVVar2 = *ppVVar22;
  ppVVar1 = &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  uVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)ppVVar1);
  uVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)ppVVar1);
  (*vk_00->_vptr_DeviceInterface[0x5d])(vk_00,pVVar2,(ulong)uVar6,(ulong)uVar7,1);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_848);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar22,0x800,0x1000,0,0,0,0,0,1,local_720);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_848);
  pVVar2 = *ppVVar22;
  pVVar8 = compute::Image::operator*((Image *)&subresourceRange.layerCount);
  dVar3 = pVVar8->m_internal;
  pVVar16 = compute::Buffer::operator*((Buffer *)local_248);
  (*vk_00->_vptr_DeviceInterface[99])(vk_00,pVVar2,dVar3,6,pVVar16->m_internal,1,&workSize);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_848);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar22,0x1000,0x4000,0,0,0,1,(int)local_780,0,0);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_848);
  endCommandBuffer(vk_00,*ppVVar22);
  ppVVar22 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_848);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar22);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_848);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_7e8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_570);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)14>_> *)local_4e8);
  pAVar9 = compute::Buffer::getAllocation((Buffer *)local_248);
  memory = ::vk::Allocation::getMemory(pAVar9);
  VVar10 = ::vk::Allocation::getOffset(pAVar9);
  ::vk::invalidateMappedMemoryRange
            (vk_00,device_00,memory,VVar10,
             (VkDeviceSize)
             inputBuffer.m_buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
             m_allocator);
  pvVar24 = ::vk::Allocation::getHostPtr(pAVar9);
  pAVar9 = compute::Buffer::getAllocation((Buffer *)local_1a8);
  pvVar25 = ::vk::Allocation::getHostPtr(pAVar9);
  ref = 0;
  do {
    if (uVar4 <= ref) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_aa0,"Compute succeeded",&local_aa1);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_aa0);
      std::__cxx11::string::~string((string *)&local_aa0);
      std::allocator<char>::~allocator(&local_aa1);
      local_a7c = 1;
LAB_00cf6228:
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)22>_> *)local_3c8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)21>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)21>_> *)local_350);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)19>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)19>_> *)local_2a8);
      compute::Buffer::~Buffer((Buffer *)local_248);
      compute::Buffer::~Buffer((Buffer *)local_1a8);
      ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
                ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_100);
      compute::Image::~Image((Image *)&subresourceRange.layerCount);
      return __return_storage_ptr__;
    }
    if (*(int *)((long)pvVar24 + (ulong)ref * 4) != *(int *)((long)pvVar25 + (ulong)ref * 4)) {
      std::__cxx11::ostringstream::ostringstream(local_a58);
      this_01 = std::operator<<((ostream *)local_a58,"Comparison failed for pixel ");
      std::ostream::operator<<(this_01,ref);
      std::__cxx11::ostringstream::str();
      tcu::TestStatus::fail(__return_storage_ptr__,&local_a78);
      std::__cxx11::string::~string((string *)&local_a78);
      local_a7c = 1;
      std::__cxx11::ostringstream::~ostringstream(local_a58);
      goto LAB_00cf6228;
    }
    ref = ref + 1;
  } while( true );
}

Assistant:

tcu::TestStatus CopySSBOToImageTestInstance::iterate (void)
{
	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Create an image

	const VkImageCreateInfo imageParams = make2DImageCreateInfo(m_imageSize, VK_IMAGE_USAGE_TRANSFER_SRC_BIT | VK_IMAGE_USAGE_STORAGE_BIT);
	const Image image(vk, device, allocator, imageParams, MemoryRequirement::Any);

	const VkImageSubresourceRange subresourceRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u);
	const Unique<VkImageView> imageView(makeImageView(vk, device, *image, VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R32_UINT, subresourceRange));

	// Create an input buffer (data to be read in the shader)

	const deUint32 imageArea = multiplyComponents(m_imageSize);
	const VkDeviceSize bufferSizeBytes = sizeof(deUint32) * imageArea;

	const Buffer inputBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_STORAGE_BUFFER_BIT), MemoryRequirement::HostVisible);

	// Populate the buffer with test data
	{
		de::Random rnd(0x77238ac2);
		const Allocation& inputBufferAllocation = inputBuffer.getAllocation();
		deUint32* bufferPtr = static_cast<deUint32*>(inputBufferAllocation.getHostPtr());
		for (deUint32 i = 0; i < imageArea; ++i)
			*bufferPtr++ = rnd.getUint32();

		flushMappedMemoryRange(vk, device, inputBufferAllocation.getMemory(), inputBufferAllocation.getOffset(), bufferSizeBytes);
	}

	// Create a buffer to store shader output (copied from image data)

	const Buffer outputBuffer(vk, device, allocator, makeBufferCreateInfo(bufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Create descriptor set

	const Unique<VkDescriptorSetLayout> descriptorSetLayout(
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device));

	const Unique<VkDescriptorPool> descriptorPool(
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u));

	const Unique<VkDescriptorSet> descriptorSet(makeDescriptorSet(vk, device, *descriptorPool, *descriptorSetLayout));

	// Set the bindings

	const VkDescriptorImageInfo imageDescriptorInfo = makeDescriptorImageInfo(DE_NULL, *imageView, VK_IMAGE_LAYOUT_GENERAL);
	const VkDescriptorBufferInfo bufferDescriptorInfo = makeDescriptorBufferInfo(*inputBuffer, 0ull, bufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &bufferDescriptorInfo)
		.writeSingle(*descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &imageDescriptorInfo)
		.update(vk, device);

	// Perform the computation
	{
		const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, m_context.getBinaryCollection().get("comp"), 0u));
		const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device, *descriptorSetLayout));
		const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

		const VkBufferMemoryBarrier inputBufferPostHostWriteBarrier = makeBufferMemoryBarrier(VK_ACCESS_HOST_WRITE_BIT, VK_ACCESS_SHADER_READ_BIT, *inputBuffer, 0ull, bufferSizeBytes);

		const VkImageMemoryBarrier imageLayoutBarrier = makeImageMemoryBarrier(
			0u, 0u,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_GENERAL,
			*image, subresourceRange);

		const VkImageMemoryBarrier imagePreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_SHADER_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_GENERAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*image, subresourceRange);

		const VkBufferMemoryBarrier outputBufferPostCopyBarrier = makeBufferMemoryBarrier(VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *outputBuffer, 0ull, bufferSizeBytes);

		const VkBufferImageCopy copyParams = makeBufferImageCopy(m_imageSize);
		const tcu::IVec2 workSize = m_imageSize / m_localSize;

		// Prepare the command buffer

		const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
		const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		// Start recording commands

		beginCommandBuffer(vk, *cmdBuffer);

		vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
		vk.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &descriptorSet.get(), 0u, DE_NULL);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &inputBufferPostHostWriteBarrier, 1, &imageLayoutBarrier);
		vk.cmdDispatch(*cmdBuffer, workSize.x(), workSize.y(), 1u);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COMPUTE_SHADER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &imagePreCopyBarrier);
		vk.cmdCopyImageToBuffer(*cmdBuffer, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *outputBuffer, 1u, &copyParams);
		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &outputBufferPostCopyBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);

		endCommandBuffer(vk, *cmdBuffer);

		// Wait for completion

		submitCommandsAndWait(vk, device, queue, *cmdBuffer);
	}

	// Validate the results

	const Allocation& outputBufferAllocation = outputBuffer.getAllocation();
	invalidateMappedMemoryRange(vk, device, outputBufferAllocation.getMemory(), outputBufferAllocation.getOffset(), bufferSizeBytes);

	const deUint32* bufferPtr = static_cast<deUint32*>(outputBufferAllocation.getHostPtr());
	const deUint32* refBufferPtr = static_cast<deUint32*>(inputBuffer.getAllocation().getHostPtr());

	for (deUint32 ndx = 0; ndx < imageArea; ++ndx)
	{
		const deUint32 res = *(bufferPtr + ndx);
		const deUint32 ref = *(refBufferPtr + ndx);

		if (res != ref)
		{
			std::ostringstream msg;
			msg << "Comparison failed for pixel " << ndx;
			return tcu::TestStatus::fail(msg.str());
		}
	}
	return tcu::TestStatus::pass("Compute succeeded");
}